

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O1

lysc_pattern ** lysc_patterns_dup(ly_ctx *ctx,lysc_pattern **orig)

{
  undefined1 *puVar1;
  long lVar2;
  lysc_pattern *plVar3;
  long *plVar4;
  lysc_pattern *plVar5;
  lysc_pattern **pplVar6;
  
  plVar5 = orig[-1];
  plVar4 = (long *)calloc(1,(long)plVar5 * 8 + 8);
  if (plVar4 == (long *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysc_patterns_dup");
    pplVar6 = (lysc_pattern **)0x0;
  }
  else {
    pplVar6 = (lysc_pattern **)(plVar4 + 1);
    memset(plVar4 + *plVar4 + 1,0,(long)plVar5 << 3);
    if (orig[-1] != (lysc_pattern *)0x0) {
      lVar2 = *plVar4;
      plVar5 = (lysc_pattern *)0x0;
      do {
        plVar3 = orig[(long)plVar5];
        puVar1 = &plVar3->field_0x38;
        *(int *)puVar1 = *(int *)puVar1 + 2;
        pplVar6[(long)plVar5] = plVar3;
        plVar5 = (lysc_pattern *)((long)&plVar5->expr + 1);
      } while (plVar5 < orig[-1]);
      *plVar4 = (long)&plVar5->expr + lVar2;
    }
  }
  return pplVar6;
}

Assistant:

static struct lysc_pattern **
lysc_patterns_dup(struct ly_ctx *ctx, struct lysc_pattern **orig)
{
    struct lysc_pattern **dup = NULL;
    LY_ARRAY_COUNT_TYPE u;

    assert(orig);

    LY_ARRAY_CREATE_RET(ctx, dup, LY_ARRAY_COUNT(orig), NULL);
    LY_ARRAY_FOR(orig, u) {
        dup[u] = lysc_pattern_dup(orig[u]);
        LY_ARRAY_INCREMENT(dup);
    }
    return dup;
}